

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O0

bool __thiscall
RuntimeInterface::TrackDebugMessenger
          (RuntimeInterface *this,XrInstance instance,XrDebugUtilsMessengerEXT messenger)

{
  mapped_type *ppXVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> mlock;
  XrDebugUtilsMessengerEXT messenger_local;
  XrInstance instance_local;
  RuntimeInterface *this_local;
  
  mlock._M_device = (mutex_type *)messenger;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->_messenger_to_instance_mutex);
  ppXVar1 = std::
            unordered_map<XrDebugUtilsMessengerEXT_T_*,_XrInstance_T_*,_std::hash<XrDebugUtilsMessengerEXT_T_*>,_std::equal_to<XrDebugUtilsMessengerEXT_T_*>,_std::allocator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>_>_>
            ::operator[](&this->_messenger_to_instance_map,(key_type *)&mlock);
  *ppXVar1 = instance;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return true;
}

Assistant:

bool RuntimeInterface::TrackDebugMessenger(XrInstance instance, XrDebugUtilsMessengerEXT messenger) {
    std::lock_guard<std::mutex> mlock(_messenger_to_instance_mutex);
    _messenger_to_instance_map[messenger] = instance;
    return true;
}